

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O2

uint32_t __thiscall
FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>::findBestB
          (NewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,uint32_t len)

{
  long lVar1;
  long lVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ulong uVar5;
  long lVar6;
  uint32_t *local_40;
  uint32_t *in_local;
  
  local_40 = in + len;
  in_local = in;
  uVar3 = maxbits<unsigned_int_const*>(&in_local,&local_40);
  lVar2 = DAT_001c3718;
  lVar1 = NewPFor<4u,FastPForLib::Simple16<false>>::possLogs;
  uVar5 = 0xffffffffffffffff;
  do {
    uVar5 = (ulong)((int)uVar5 + 1);
  } while (*(int *)(NewPFor<4u,FastPForLib::Simple16<false>>::possLogs + uVar5 * 4) + 0x1cU < uVar3)
  ;
  lVar6 = DAT_001c3718 - NewPFor<4u,FastPForLib::Simple16<false>>::possLogs;
  do {
    if ((lVar6 >> 2) - 1U <= uVar5) {
      return *(uint32_t *)(lVar2 + -4);
    }
    uVar3 = *(uint32_t *)(lVar1 + uVar5 * 4);
    uVar4 = tryB(uVar3,in,len);
    uVar5 = (ulong)((int)uVar5 + 1);
  } while (len < uVar4 * 10);
  return uVar3;
}

Assistant:

__attribute__((pure)) uint32_t
NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::findBestB(
    const uint32_t *in, uint32_t len) {
  const uint32_t mb = maxbits(in, in + len);
  uint32_t i = 0;
  while (mb > 28 + possLogs[i])
    ++i; // some schemes such as Simple16 don't code numbers greater than 28

  for (; i < possLogs.size() - 1; i++) {

    const uint32_t nExceptions = tryB(possLogs[i], in, len);
    if (nExceptions * PFORDELTA_INVERSERATIO <= len)
      return possLogs[i];
  }
  return possLogs.back();
}